

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool __thiscall QNetmask::setAddress(QNetmask *this,QHostAddress *address)

{
  char cVar1;
  char cVar2;
  NetworkLayerProtocol NVar3;
  uint uVar4;
  QHostAddress *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Q_IPV6ADDR QVar5;
  quint8 *end;
  quint8 *ptr;
  int netmask;
  anon_union_16_2_f9ece763 ip;
  QHostAddress *this_00;
  long *plVar6;
  long *local_50;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar7;
  bool local_29;
  long local_28;
  undefined8 local_20;
  undefined1 local_18 [8];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  iVar7 = 0;
  local_50 = (long *)local_18;
  this_00 = (QHostAddress *)0xaaaaaaaaaaaaaaaa;
  *in_RDI = -1;
  NVar3 = QHostAddress::protocol((QHostAddress *)0x2165c0);
  if (NVar3 == IPv4Protocol) {
    QHostAddress::toIPv4Address(in_RSI,(bool *)CONCAT44(iVar7,in_stack_ffffffffffffffb8));
    uVar4 = qToBigEndian<unsigned_int>(0);
    local_18._0_4_ = uVar4;
    plVar6 = (long *)(local_18 + 4);
  }
  else {
    NVar3 = QHostAddress::protocol((QHostAddress *)0x2165f8);
    if (NVar3 != IPv6Protocol) {
      local_29 = false;
      goto LAB_002167a4;
    }
    QVar5 = QHostAddress::toIPv6Address(this_00);
    local_28 = QVar5.c._0_8_;
    local_18 = (undefined1  [8])local_28;
    local_20 = QVar5.c._8_8_;
    local_10 = local_20;
    plVar6 = &local_8;
  }
  while( true ) {
    cVar2 = (char)iVar7;
    if ((plVar6 <= local_50) || (cVar1 = (char)*local_50, cVar1 == '\0')) goto LAB_00216756;
    if (cVar1 == -0x80) break;
    if (cVar1 == -0x40) {
LAB_0021673c:
      cVar2 = cVar2 + '\x01';
      break;
    }
    if (cVar1 == -0x20) {
LAB_00216731:
      cVar2 = cVar2 + '\x01';
      goto LAB_0021673c;
    }
    if (cVar1 == -0x10) {
LAB_00216726:
      cVar2 = cVar2 + '\x01';
      goto LAB_00216731;
    }
    if (cVar1 == -8) {
LAB_0021671b:
      cVar2 = cVar2 + '\x01';
      goto LAB_00216726;
    }
    if (cVar1 == -4) {
LAB_00216710:
      cVar2 = cVar2 + '\x01';
      goto LAB_0021671b;
    }
    if (cVar1 == -2) {
      cVar2 = cVar2 + '\x01';
      goto LAB_00216710;
    }
    if (cVar1 != -1) {
      local_29 = false;
      goto LAB_002167a4;
    }
    iVar7 = iVar7 + 8;
    local_50 = (long *)((long)local_50 + 1);
  }
  cVar2 = cVar2 + '\x01';
LAB_00216756:
  if ((local_50 < plVar6) &&
     (iVar7 = memcmp((char *)((long)local_50 + 1),"",(size_t)((long)plVar6 + (-1 - (long)local_50)))
     , iVar7 != 0)) {
    local_29 = false;
  }
  else {
    *in_RDI = cVar2;
    local_29 = true;
  }
LAB_002167a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QNetmask::setAddress(const QHostAddress &address)
{
    static const quint8 zeroes[16] = { 0 };
    union {
        quint32 v4;
        quint8 v6[16];
    } ip;

    int netmask = 0;
    quint8 *ptr = ip.v6;
    quint8 *end;
    length = 255;

    if (address.protocol() == QHostAddress::IPv4Protocol) {
        ip.v4 = qToBigEndian(address.toIPv4Address());
        end = ptr + 4;
    } else if (address.protocol() == QHostAddress::IPv6Protocol) {
        memcpy(ip.v6, address.toIPv6Address().c, 16);
        end = ptr + 16;
    } else {
        return false;
    }

    while (ptr < end) {
        switch (*ptr) {
        case 255:
            netmask += 8;
            ++ptr;
            continue;

        default:
            return false;       // invalid IP-style netmask

        case 254:
            ++netmask;
            Q_FALLTHROUGH();
        case 252:
            ++netmask;
            Q_FALLTHROUGH();
        case 248:
            ++netmask;
            Q_FALLTHROUGH();
        case 240:
            ++netmask;
            Q_FALLTHROUGH();
        case 224:
            ++netmask;
            Q_FALLTHROUGH();
        case 192:
            ++netmask;
            Q_FALLTHROUGH();
        case 128:
            ++netmask;
            Q_FALLTHROUGH();
        case 0:
            break;
        }
        break;
    }

    // confirm that the rest is only zeroes
    if (ptr < end && memcmp(ptr + 1, zeroes, end - ptr - 1) != 0)
        return false;

    length = netmask;
    return true;
}